

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O1

string * __thiscall
Config::GetValue_abi_cxx11_(string *__return_storage_ptr__,Config *this,char *key)

{
  ushort uVar1;
  uint uVar2;
  uint __val;
  uint uVar3;
  ConstMemberIterator CVar4;
  Type pGVar5;
  Ch *__s;
  uint uVar6;
  ulong uVar7;
  uint __len;
  allocator<char> local_31;
  Pointer local_30;
  
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_30,(Ch *)this);
  CVar4 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::MemberEnd((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)this);
  if (local_30 != CVar4.ptr_) {
    pGVar5 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)this,key);
    uVar1 = (pGVar5->data_).f.flags;
    pGVar5 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)this,key);
    if ((uVar1 >> 10 & 1) == 0) {
      if ((undefined1  [16])((undefined1  [16])pGVar5->data_ & (undefined1  [16])0x20000000000000)
          == (undefined1  [16])0x0) goto LAB_0021effc;
      uVar2 = (pGVar5->data_).s.length;
      __val = -uVar2;
      if (0 < (int)uVar2) {
        __val = uVar2;
      }
      __len = 1;
      if (9 < __val) {
        uVar7 = (ulong)__val;
        uVar3 = 4;
        do {
          __len = uVar3;
          uVar6 = (uint)uVar7;
          if (uVar6 < 100) {
            __len = __len - 2;
            goto LAB_0021efab;
          }
          if (uVar6 < 1000) {
            __len = __len - 1;
            goto LAB_0021efab;
          }
          if (uVar6 < 10000) goto LAB_0021efab;
          uVar7 = uVar7 / 10000;
          uVar3 = __len + 4;
        } while (99999 < uVar6);
        __len = __len + 1;
      }
LAB_0021efab:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct
                ((ulong)__return_storage_ptr__,(char)__len - (char)((int)uVar2 >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((__return_storage_ptr__->_M_dataplus)._M_p + (uVar2 >> 0x1f),__len,__val);
    }
    else {
      __s = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetString(pGVar5);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,__s,&local_31);
    }
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__throw_logic_error("basic_string::_M_construct null not valid");
LAB_0021effc:
  __assert_fail("data_.f.flags & kIntFlag",
                "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/rapidjson/document.h"
                ,0x6e7,
                "int rapidjson::GenericValue<rapidjson::UTF8<>>::GetInt() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
               );
}

Assistant:

std::string Config::GetValue(const char* key)
{
    if(Settings.HasMember(key))
    {
        if(Settings[key].IsString())
        {
            return Settings[key].GetString();
        }
        else
        {
            return std::to_string(Settings[key].GetInt());
        }
        
    }

    return nullptr;
}